

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj_decoder.cc
# Opt level: O0

void __thiscall draco::ObjDecoder::ResetCounters(ObjDecoder *this)

{
  ObjDecoder *this_local;
  
  this->num_obj_faces_ = 0;
  this->num_positions_ = 0;
  this->num_tex_coords_ = 0;
  this->num_normals_ = 0;
  this->last_material_id_ = 0;
  this->last_sub_obj_id_ = 0;
  return;
}

Assistant:

void ObjDecoder::ResetCounters() {
  num_obj_faces_ = 0;
  num_positions_ = 0;
  num_tex_coords_ = 0;
  num_normals_ = 0;
  last_material_id_ = 0;
  last_sub_obj_id_ = 0;
}